

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

string * cmSystemTools::FileExistsInParentDirectories
                   (string *__return_storage_ptr__,string *fname,string *directory,string *toplevel)

{
  bool bVar1;
  string dir;
  string prevDir;
  string file;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_70,(string *)fname);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_70);
  std::__cxx11::string::string((string *)&local_b0,(string *)directory);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_b0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  do {
    bVar1 = std::operator!=(&local_b0,&local_90);
    if (!bVar1) {
LAB_00151f69:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_50);
LAB_00151f7d:
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      return __return_storage_ptr__;
    }
    std::operator+(&local_50,&local_b0,"/");
    std::operator+(__return_storage_ptr__,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = cmsys::SystemTools::FileExists(__return_storage_ptr__);
    if (bVar1) goto LAB_00151f7d;
    if (local_b0._M_string_length < toplevel->_M_string_length) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      goto LAB_00151f69;
    }
    std::__cxx11::string::_M_assign((string *)&local_90);
    cmsys::SystemTools::GetParentDirectory(&local_50,&local_b0);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  } while( true );
}

Assistant:

std::string cmSystemTools::FileExistsInParentDirectories(
  const std::string& fname, const std::string& directory,
  const std::string& toplevel)
{
  std::string file = fname;
  cmSystemTools::ConvertToUnixSlashes(file);
  std::string dir = directory;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::string prevDir;
  while (dir != prevDir) {
    std::string path = dir + "/" + file;
    if (cmSystemTools::FileExists(path)) {
      return path;
    }
    if (dir.size() < toplevel.size()) {
      break;
    }
    prevDir = dir;
    dir = cmSystemTools::GetParentDirectory(dir);
  }
  return "";
}